

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_close(nng_listener lid)

{
  nni_listener *pnStack_18;
  int rv;
  nni_listener *l;
  nng_listener lid_local;
  
  l._0_4_ = lid.id;
  l._4_4_ = nni_listener_find(&stack0xffffffffffffffe8,lid.id);
  if (l._4_4_ == 0) {
    nni_listener_close(pnStack_18);
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int
nng_listener_close(nng_listener lid)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	nni_listener_close(l);
	return (0);
}